

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool execAdbCommand(QStringList *args,QByteArray *output,bool verbose)

{
  initializer_list<QString> args_00;
  QLatin1StringView latin1;
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  QStringList argsWithSerial;
  QString *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  QList<QString> *in_stack_ffffffffffffff58;
  QList<QString> *l;
  iterator in_stack_ffffffffffffff60;
  QList<QString> *this;
  size_type in_stack_ffffffffffffff68;
  qsizetype in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffffaf;
  QByteArray *in_stack_ffffffffffffffb0;
  QByteArray *output_00;
  QStringList *in_stack_ffffffffffffffb8;
  QStringList *args_01;
  QString *in_stack_ffffffffffffffc0;
  QString *program;
  QList<QString> local_38 [2];
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x106faa);
  if (bVar1) {
    bVar2 = execCommand(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  }
  else {
    output_00 = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    args_01 = (QStringList *)0xaaaaaaaaaaaaaaaa;
    program = (QString *)0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_ffffffffffffff58,
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    latin1.m_data = in_stack_ffffffffffffff88;
    latin1.m_size = in_stack_ffffffffffffff80;
    QString::QString(in_stack_ffffffffffffff60,latin1);
    QString::QString((QString *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48);
    args_00._M_len = in_stack_ffffffffffffff68;
    args_00._M_array = in_stack_ffffffffffffff60;
    QList<QString>::QList(in_stack_ffffffffffffff58,args_00);
    this = local_38;
    l = (QList<QString> *)&stack0xfffffffffffffff8;
    do {
      l = l + -1;
      QString::~QString((QString *)0x1070a3);
    } while (l != this);
    QList<QString>::append(this,l);
    bVar2 = execCommand(program,args_01,output_00,(bool)in_stack_ffffffffffffffaf);
    QList<QString>::~QList((QList<QString> *)0x1070f9);
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool execAdbCommand(const QStringList &args, QByteArray *output = nullptr,
                           bool verbose = true)
{
    if (g_options.serial.isEmpty())
        return execCommand(g_options.adbCommand, args, output, verbose);

    QStringList argsWithSerial = {"-s"_L1, g_options.serial};
    argsWithSerial.append(args);

    return execCommand(g_options.adbCommand, argsWithSerial, output, verbose);
}